

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GraphicsAccessories.cpp
# Opt level: O2

RENDER_DEVICE_TYPE Diligent::ArchiveDataFlagToRenderDeviceType(ARCHIVE_DEVICE_DATA_FLAGS Flag)

{
  ARCHIVE_DEVICE_DATA_FLAGS AVar1;
  string msg;
  
  AVar1 = Flag - ARCHIVE_DEVICE_DATA_FLAG_D3D11;
  if ((Flag ^ AVar1) <= AVar1) {
    FormatString<char[29]>(&msg,(char (*) [29])"Exactly one flag is expected");
    DebugAssertionFailed
              (msg._M_dataplus._M_p,"ArchiveDataFlagToRenderDeviceType",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsAccessories/src/GraphicsAccessories.cpp"
               ,0x791);
    std::__cxx11::string::~string((string *)&msg);
  }
  if (ARCHIVE_DEVICE_DATA_FLAG_D3D11 < AVar1) {
    if (Flag == ARCHIVE_DEVICE_DATA_FLAG_LAST) {
      Flag = RENDER_DEVICE_TYPE_WEBGPU;
    }
    else if (Flag == ARCHIVE_DEVICE_DATA_FLAG_GLES) {
      Flag = RENDER_DEVICE_TYPE_GLES;
    }
    else if (Flag == ARCHIVE_DEVICE_DATA_FLAG_VULKAN) {
      Flag = RENDER_DEVICE_TYPE_VULKAN;
    }
    else if ((Flag == ARCHIVE_DEVICE_DATA_FLAG_METAL_MACOS) ||
            (Flag == ARCHIVE_DEVICE_DATA_FLAG_METAL_IOS)) {
      Flag = RENDER_DEVICE_TYPE_METAL;
    }
    else if (Flag == ARCHIVE_DEVICE_DATA_FLAG_GL) {
      Flag = RENDER_DEVICE_TYPE_GL;
    }
    else {
      FormatString<char[36]>(&msg,(char (*) [36])"Unexpected archive device data flag");
      DebugAssertionFailed
                (msg._M_dataplus._M_p,"ArchiveDataFlagToRenderDeviceType",
                 "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsAccessories/src/GraphicsAccessories.cpp"
                 ,0x7ab);
      std::__cxx11::string::~string((string *)&msg);
      Flag = RENDER_DEVICE_TYPE_UNDEFINED;
    }
  }
  return Flag;
}

Assistant:

RENDER_DEVICE_TYPE ArchiveDataFlagToRenderDeviceType(ARCHIVE_DEVICE_DATA_FLAGS Flag)
{
    VERIFY(IsPowerOfTwo(Flag), "Exactly one flag is expected");
    switch (Flag)
    {
        case ARCHIVE_DEVICE_DATA_FLAG_D3D11:
            return RENDER_DEVICE_TYPE_D3D11;

        case ARCHIVE_DEVICE_DATA_FLAG_D3D12:
            return RENDER_DEVICE_TYPE_D3D12;

        case ARCHIVE_DEVICE_DATA_FLAG_GL:
            return RENDER_DEVICE_TYPE_GL;

        case ARCHIVE_DEVICE_DATA_FLAG_GLES:
            return RENDER_DEVICE_TYPE_GLES;

        case ARCHIVE_DEVICE_DATA_FLAG_VULKAN:
            return RENDER_DEVICE_TYPE_VULKAN;

        case ARCHIVE_DEVICE_DATA_FLAG_METAL_MACOS:
        case ARCHIVE_DEVICE_DATA_FLAG_METAL_IOS:
            return RENDER_DEVICE_TYPE_METAL;

        case ARCHIVE_DEVICE_DATA_FLAG_WEBGPU:
            return RENDER_DEVICE_TYPE_WEBGPU;

        default:
            UNEXPECTED("Unexpected archive device data flag");
            return RENDER_DEVICE_TYPE_UNDEFINED;
    }
}